

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

shared_ptr<polyscope::render::AttributeBuffer> __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::
getIndexedRenderAttributeBuffer
          (ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this,
          ManagedBuffer<unsigned_int> *indices)

{
  pointer ptVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  ManagedBuffer<unsigned_int> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
  *existingViewTup;
  pointer ptVar3;
  shared_ptr<polyscope::render::AttributeBuffer> sVar4;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  expandData;
  _Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  local_50;
  ManagedBuffer<unsigned_int> *local_38;
  
  checkDeviceBufferTypeIs
            ((ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)indices,Attribute);
  removeDeletedIndexedViews((ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)indices)
  ;
  ptVar1 = (indices->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar3 = (indices->existingIndexedViews).
                super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    std::__shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2> *)this,
               ptVar3);
    if ((this->_vptr_ManagedBuffer != (_func_int **)0x0) &&
       (_Var2._M_pi = extraout_RDX,
       ((ptVar3->
        super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
        ).super__Head_base<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_false>.
       _M_head_impl)->uniqueID == in_RDX->uniqueID)) goto LAB_001f149e;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->name);
  }
  ensureHostBufferPopulated((ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)indices)
  ;
  generateAttributeBuffer<glm::vec<4,unsigned_int,(glm::qualifier)0>>((render *)this,render::engine)
  ;
  ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(in_RDX);
  gather<glm::vec<4,unsigned_int,(glm::qualifier)0>>
            ((vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
              *)&local_50,(polyscope *)indices->data,
             (vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
              *)in_RDX->data,in_RCX);
  (**(code **)(*this->_vptr_ManagedBuffer + 0x58))(this->_vptr_ManagedBuffer,&local_50);
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>,std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>>>
  ::
  emplace_back<polyscope::render::ManagedBuffer<unsigned_int>*,std::shared_ptr<polyscope::render::AttributeBuffer>&>
            ((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>,std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>>>
              *)&indices->existingIndexedViews,&local_38,
             (shared_ptr<polyscope::render::AttributeBuffer> *)this);
  std::
  _Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_50);
  _Var2._M_pi = extraout_RDX_00;
LAB_001f149e:
  sVar4.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<polyscope::render::AttributeBuffer>)
         sVar4.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<render::AttributeBuffer>
ManagedBuffer<T>::getIndexedRenderAttributeBuffer(ManagedBuffer<uint32_t>& indices) {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  // Check if we have already created this indexed view, and if so just return it
  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    // both the cache-key source index ptr and the view buffer ptr must still be alive (and the index must match)
    // note that we can't verify that the index buffer is still alive, you will just get memory errors here if it
    // has been deleted
    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (viewBufferPtr) {
      render::ManagedBuffer<uint32_t>& indexBufferCand = *(std::get<0>(existingViewTup));
      if (indexBufferCand.uniqueID == indices.uniqueID) {
        return viewBufferPtr;
      }
    }
  }

  // We don't have it. Create a new one and return that.
  ensureHostBufferPopulated();
  std::shared_ptr<render::AttributeBuffer> newBuffer = generateAttributeBuffer<T>(render::engine);
  indices.ensureHostBufferPopulated();
  std::vector<T> expandData = gather(data, indices.data);
  newBuffer->setData(expandData); // initially populate
  existingIndexedViews.emplace_back(&indices, newBuffer);

  return newBuffer;
}